

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmBcc<(moira::Instr)22,(moira::Mode)12,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char cVar1;
  u32 uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  
  uVar2 = *addr;
  pcVar5 = "dbls";
  if (str->upper != false) {
    pcVar5 = "DBLS";
  }
  pcVar5 = pcVar5 + 1;
  cVar1 = *pcVar5;
  while (cVar1 != '\0') {
    pcVar5 = pcVar5 + 1;
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = cVar1;
    cVar1 = *pcVar5;
  }
  iVar3 = (this->tab).raw;
  while (pcVar5 = str->ptr, pcVar5 < str->base + iVar3) {
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  StrWriter::operator<<(str,(UInt)((int)(char)op + uVar2 + 2));
  return;
}

Assistant:

void
Moira::dasmBcc(StrWriter &str, u32 &addr, u16 op)
{
    if (MIMIC_MUSASHI && S == Byte && (u8)op == 0xFF) {
        dasmIllegal(str, addr, op);
        return;
    }

    u32 dst = addr + 2;
    dst += (S == Byte) ? (i8)op : (i16)dasmRead<S>(addr);

    str << Ins<I>{} << tab << UInt(dst);
}